

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int HistoQueueUpdatePair
              (VP8LHistogram *h1,VP8LHistogram *h2,int64_t cost_threshold,HistogramPair *pair)

{
  int iVar1;
  uint64_t a;
  long in_RCX;
  long in_RSI;
  uint64_t *in_RDI;
  VP8LHistogram *unaff_retaddr;
  int64_t sum_cost;
  int64_t local_20 [2];
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  a = in_RDI[0x196] + *(long *)(in_RSI + 0xcb0);
  SaturateAdd(a,local_20);
  iVar1 = GetCombinedHistogramEntropy
                    ((VP8LHistogram *)sum_cost,unaff_retaddr,
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  if (iVar1 != 0) {
    *(uint64_t *)(in_RCX + 8) = *(long *)(in_RCX + 0x10) - a;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

WEBP_NODISCARD static int HistoQueueUpdatePair(const VP8LHistogram* const h1,
                                               const VP8LHistogram* const h2,
                                               int64_t cost_threshold,
                                               HistogramPair* const pair) {
  const int64_t sum_cost = h1->bit_cost_ + h2->bit_cost_;
  SaturateAdd(sum_cost, &cost_threshold);
  if (!GetCombinedHistogramEntropy(h1, h2, cost_threshold, &pair->cost_combo)) {
    return 0;
  }
  pair->cost_diff = (int64_t)pair->cost_combo - sum_cost;
  return 1;
}